

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall Assimp::XFileParser::ParseDataObjectAnimationSet(XFileParser *this)

{
  bool bVar1;
  Animation *this_00;
  long lVar2;
  Logger *this_01;
  int local_98;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  string objectName;
  Animation *pAStack_48;
  bool running;
  Animation *anim;
  undefined1 local_30 [8];
  string animName;
  XFileParser *this_local;
  
  animName.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  readHeadOfDataObject(this,(string *)local_30);
  this_00 = (Animation *)operator_new(0x38);
  XFile::Animation::Animation(this_00);
  pAStack_48 = this_00;
  std::vector<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>::push_back
            (&this->mScene->mAnims,&stack0xffffffffffffffb8);
  std::__cxx11::string::operator=((string *)pAStack_48,(string *)local_30);
  objectName.field_2._M_local_buf[0xf] = '\x01';
  do {
    if ((objectName.field_2._M_local_buf[0xf] & 1U) == 0) break;
    GetNextToken_abi_cxx11_((string *)local_70,this);
    lVar2 = std::__cxx11::string::length();
    if (lVar2 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"Unexpected end of file while parsing animation set.",&local_91
                );
      ThrowException(this,&local_90);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_70,"}");
    if (bVar1) {
      local_98 = 3;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_70,"Animation");
      if (bVar1) {
        ParseDataObjectAnimation(this,pAStack_48);
      }
      else {
        this_01 = DefaultLogger::get();
        Logger::warn(this_01,"Unknown data object in animation set in x file");
        ParseUnknownDataObject(this);
      }
      local_98 = 0;
    }
    std::__cxx11::string::~string((string *)local_70);
  } while (local_98 == 0);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void XFileParser::ParseDataObjectAnimationSet()
{
    std::string animName;
    readHeadOfDataObject( &animName);

    Animation* anim = new Animation;
    mScene->mAnims.push_back( anim);
    anim->mName = animName;

    bool running = true;
    while ( running )
    {
        std::string objectName = GetNextToken();
        if( objectName.length() == 0)
            ThrowException( "Unexpected end of file while parsing animation set.");
        else
        if( objectName == "}")
            break; // animation set finished
        else
        if( objectName == "Animation")
            ParseDataObjectAnimation( anim);
        else
        {
            ASSIMP_LOG_WARN("Unknown data object in animation set in x file");
            ParseUnknownDataObject();
        }
    }
}